

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O3

set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
* __thiscall
PSEngine::get_absolute_directions_from_rule_direction
          (set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
           *__return_storage_ptr__,PSEngine *this,RuleDirection p_rule_direction)

{
  _Rb_tree_header *p_Var1;
  AbsoluteDirection local_14;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  switch(p_rule_direction) {
  case Up:
    std::
    _Rb_tree<PSEngine::AbsoluteDirection,_PSEngine::AbsoluteDirection,_std::_Identity<PSEngine::AbsoluteDirection>,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
    ::_M_insert_unique<PSEngine::AbsoluteDirection>(&__return_storage_ptr__->_M_t,&local_14);
    break;
  case Down:
    std::
    _Rb_tree<PSEngine::AbsoluteDirection,_PSEngine::AbsoluteDirection,_std::_Identity<PSEngine::AbsoluteDirection>,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
    ::_M_insert_unique<PSEngine::AbsoluteDirection>(&__return_storage_ptr__->_M_t,&local_14);
    break;
  case Left:
    std::
    _Rb_tree<PSEngine::AbsoluteDirection,_PSEngine::AbsoluteDirection,_std::_Identity<PSEngine::AbsoluteDirection>,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
    ::_M_insert_unique<PSEngine::AbsoluteDirection>(&__return_storage_ptr__->_M_t,&local_14);
    break;
  case Right:
    std::
    _Rb_tree<PSEngine::AbsoluteDirection,_PSEngine::AbsoluteDirection,_std::_Identity<PSEngine::AbsoluteDirection>,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
    ::_M_insert_unique<PSEngine::AbsoluteDirection>(&__return_storage_ptr__->_M_t,&local_14);
    break;
  case Horizontal:
    std::
    _Rb_tree<PSEngine::AbsoluteDirection,_PSEngine::AbsoluteDirection,_std::_Identity<PSEngine::AbsoluteDirection>,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
    ::_M_insert_unique<PSEngine::AbsoluteDirection>(&__return_storage_ptr__->_M_t,&local_14);
    std::
    _Rb_tree<PSEngine::AbsoluteDirection,_PSEngine::AbsoluteDirection,_std::_Identity<PSEngine::AbsoluteDirection>,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
    ::_M_insert_unique<PSEngine::AbsoluteDirection>(&__return_storage_ptr__->_M_t,&local_14);
    break;
  case Vertical:
    std::
    _Rb_tree<PSEngine::AbsoluteDirection,_PSEngine::AbsoluteDirection,_std::_Identity<PSEngine::AbsoluteDirection>,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
    ::_M_insert_unique<PSEngine::AbsoluteDirection>(&__return_storage_ptr__->_M_t,&local_14);
    std::
    _Rb_tree<PSEngine::AbsoluteDirection,_PSEngine::AbsoluteDirection,_std::_Identity<PSEngine::AbsoluteDirection>,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
    ::_M_insert_unique<PSEngine::AbsoluteDirection>(&__return_storage_ptr__->_M_t,&local_14);
    break;
  default:
    std::
    _Rb_tree<PSEngine::AbsoluteDirection,_PSEngine::AbsoluteDirection,_std::_Identity<PSEngine::AbsoluteDirection>,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
    ::_M_insert_unique<PSEngine::AbsoluteDirection>(&__return_storage_ptr__->_M_t,&local_14);
    std::
    _Rb_tree<PSEngine::AbsoluteDirection,_PSEngine::AbsoluteDirection,_std::_Identity<PSEngine::AbsoluteDirection>,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
    ::_M_insert_unique<PSEngine::AbsoluteDirection>(&__return_storage_ptr__->_M_t,&local_14);
    std::
    _Rb_tree<PSEngine::AbsoluteDirection,_PSEngine::AbsoluteDirection,_std::_Identity<PSEngine::AbsoluteDirection>,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
    ::_M_insert_unique<PSEngine::AbsoluteDirection>(&__return_storage_ptr__->_M_t,&local_14);
    std::
    _Rb_tree<PSEngine::AbsoluteDirection,_PSEngine::AbsoluteDirection,_std::_Identity<PSEngine::AbsoluteDirection>,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
    ::_M_insert_unique<PSEngine::AbsoluteDirection>(&__return_storage_ptr__->_M_t,&local_14);
  }
  return __return_storage_ptr__;
}

Assistant:

set<PSEngine::AbsoluteDirection> PSEngine::get_absolute_directions_from_rule_direction(CompiledGame::RuleDirection p_rule_direction)
{
    set<AbsoluteDirection> results;
    switch (p_rule_direction)
    {
    case CompiledGame::RuleDirection::Up:
        results.insert(AbsoluteDirection::Up);
        break;
    case CompiledGame::RuleDirection::Down:
        results.insert(AbsoluteDirection::Down);
        break;
    case CompiledGame::RuleDirection::Left:
        results.insert(AbsoluteDirection::Left);
        break;
    case CompiledGame::RuleDirection::Right:
        results.insert(AbsoluteDirection::Right);
        break;
    case CompiledGame::RuleDirection::Horizontal:
        results.insert(AbsoluteDirection::Left);
        results.insert(AbsoluteDirection::Right);
        break;
    case CompiledGame::RuleDirection::Vertical:
        results.insert(AbsoluteDirection::Up);
        results.insert(AbsoluteDirection::Down);
        break;
    default:
        results.insert(AbsoluteDirection::Up);
        results.insert(AbsoluteDirection::Down);
        results.insert(AbsoluteDirection::Left);
        results.insert(AbsoluteDirection::Right);
        break;
    }

    return results;
}